

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

int Read<int>(IOStream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  DeadlyImportError *this;
  allocator local_3d;
  int t;
  string local_38;
  
  iVar1 = (*stream->_vptr_IOStream[2])(stream,&t,4,1);
  if (CONCAT44(extraout_var,iVar1) == 1) {
    return t;
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"Unexpected EOF",&local_3d);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Read(IOStream * stream) {
    T t;
    size_t res = stream->Read( &t, sizeof(T), 1 );
    if(res != 1)
        throw DeadlyImportError("Unexpected EOF");
    return t;
}